

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O0

int domindblast(void)

{
  monst *pmVar1;
  int iVar2;
  char *pcVar3;
  obj *poVar4;
  bool bVar5;
  char *local_38;
  int u_sen;
  monst *nmon;
  monst *mtmp;
  
  if (u.uen < 10) {
    pline("You concentrate but lack the energy to maintain doing so.");
    mtmp._4_4_ = 0;
  }
  else {
    u.uen = u.uen + -10;
    iflags.botl = '\x01';
    pline("You concentrate.");
    if ((uarmh == (obj *)0x0) || (uarmh->otyp != 0x4f)) {
      pline("A wave of psychic energy pours out.");
      pmVar1 = level->monlist;
      while (nmon = pmVar1, nmon != (monst *)0x0) {
        pmVar1 = nmon->nmon;
        if (((0 < nmon->mhp) &&
            (iVar2 = dist2((int)nmon->mx,(int)nmon->my,(int)u.ux,(int)u.uy), iVar2 < 0x41)) &&
           ((*(uint *)&nmon->field_0x60 >> 0x16 & 1) == 0)) {
          if (((nmon->data == mons + 0x1e) || (nmon->data == mons + 0x31)) ||
             (bVar5 = false, nmon->data == mons + 0x32)) {
            bVar5 = (*(uint *)&nmon->field_0x60 >> 0x11 & 1) == 0;
          }
          if (((bVar5) ||
              ((((nmon->data == mons + 0x1e || (nmon->data == mons + 0x31)) ||
                (nmon->data == mons + 0x32)) && (iVar2 = rn2(2), iVar2 != 0)))) ||
             (((iVar2 = rn2(10), iVar2 == 0 && (poVar4 = which_armor(nmon,4), poVar4 != (obj *)0x0))
              && (poVar4 = which_armor(nmon,4), poVar4->otyp != 0x4f)))) {
            pcVar3 = mon_nam(nmon);
            pcVar3 = s_suffix(pcVar3);
            if (bVar5) {
              local_38 = "telepathy";
            }
            else {
              bVar5 = true;
              if ((nmon->data != mons + 0x1e) && (bVar5 = true, nmon->data != mons + 0x31)) {
                bVar5 = nmon->data == mons + 0x32;
              }
              local_38 = "mind";
              if (bVar5) {
                local_38 = "latent telepathy";
              }
            }
            pline("You lock in on %s %s.",pcVar3,local_38);
            iVar2 = rnd(0xf);
            nmon->mhp = nmon->mhp - iVar2;
            if (nmon->mhp < 1) {
              killed(nmon);
            }
          }
        }
      }
      mtmp._4_4_ = 1;
    }
    else {
      pcVar3 = yname(uarmh);
      pline("A wave of psychic energy pours out, but it is blocked by %s.",pcVar3);
      mtmp._4_4_ = 0;
    }
  }
  return mtmp._4_4_;
}

Assistant:

int domindblast(void)
{
	struct monst *mtmp, *nmon;

	if (u.uen < 10) {
	    pline("You concentrate but lack the energy to maintain doing so.");
	    return 0;
	}
	u.uen -= 10;
	iflags.botl = 1;

	pline("You concentrate.");
	if (uarmh && uarmh->otyp == TINFOIL_HAT) {
		pline("A wave of psychic energy pours out, but it is blocked by %s.",
		      yname(uarmh));
		return 0;
	}
	pline("A wave of psychic energy pours out.");
	for (mtmp=level->monlist; mtmp; mtmp = nmon) {
		int u_sen;

		nmon = mtmp->nmon;
		if (DEADMONSTER(mtmp))
			continue;
		if (distu(mtmp->mx, mtmp->my) > BOLT_LIM * BOLT_LIM)
			continue;
		if (mtmp->mpeaceful)
			continue;
		u_sen = telepathic(mtmp->data) && !mtmp->mcansee;
		if (u_sen || (telepathic(mtmp->data) && rn2(2)) ||
		    (!rn2(10) && which_armor(mtmp, W_ARMH) &&
		     which_armor(mtmp, W_ARMH)->otyp != TINFOIL_HAT)) {
			pline("You lock in on %s %s.", s_suffix(mon_nam(mtmp)),
				u_sen ? "telepathy" :
				telepathic(mtmp->data) ? "latent telepathy" :
				"mind");
			mtmp->mhp -= rnd(15);
			if (mtmp->mhp <= 0)
				killed(mtmp);
		}
	}
	return 1;
}